

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::UnicodeSurrogatesTest(void)

{
  bool expval;
  uint *puVar1;
  String *pSVar2;
  IDLOptions IStack_a98;
  Parser parser;
  
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&parser,&IStack_a98);
  IDLOptions::~IDLOptions(&IStack_a98);
  expval = Parser::Parse(&parser,"table T { F:string (id: 0); }root_type T;{ F:\"\\uD83D\\uDCA9\"}",
                         (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser.Parse(\"table T { F:string (id: 0); }\" \"root_type T;\" \"{ F:\\\"\\\\uD83D\\\\uDCA9\\\"}\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x31c,"");
  puVar1 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
  pSVar2 = Table::GetPointer<flatbuffers::String*,unsigned_int>
                     ((Table *)((ulong)*puVar1 + (long)puVar1),4);
  TestEqStr((char *)(pSVar2 + 1),anon_var_dwarf_3166af,
            "\'string->c_str()\' != \'\"\\xF0\\x9F\\x92\\xA9\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x321,"");
  Parser::~Parser(&parser);
  return;
}

Assistant:

void UnicodeSurrogatesTest() {
  flatbuffers::Parser parser;

  TEST_EQ(parser.Parse("table T { F:string (id: 0); }"
                       "root_type T;"
                       "{ F:\"\\uD83D\\uDCA9\"}"),
          true);
  auto root = flatbuffers::GetRoot<flatbuffers::Table>(
      parser.builder_.GetBufferPointer());
  auto string = root->GetPointer<flatbuffers::String *>(
      flatbuffers::FieldIndexToOffset(0));
  TEST_EQ_STR(string->c_str(), "\xF0\x9F\x92\xA9");
}